

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O0

void __thiscall
duckdb::Serializer::WriteValue<double,unsigned_long>
          (Serializer *this,pair<double,_unsigned_long> *pair)

{
  char *in_RSI;
  double *in_RDI;
  Serializer *unaff_retaddr;
  double *pdVar1;
  field_id_t field_id;
  
  pdVar1 = in_RDI;
  (**(code **)((long)*in_RDI + 0x30))();
  field_id = (field_id_t)((ulong)pdVar1 >> 0x30);
  WriteProperty<double>(unaff_retaddr,field_id,in_RSI,in_RDI);
  WriteProperty<unsigned_long>(unaff_retaddr,field_id,in_RSI,(unsigned_long *)in_RDI);
  (**(code **)((long)*in_RDI + 0x38))();
  return;
}

Assistant:

void WriteValue(const std::pair<K, V> &pair) {
		OnObjectBegin();
		WriteProperty(0, "first", pair.first);
		WriteProperty(1, "second", pair.second);
		OnObjectEnd();
	}